

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async_callback.cpp
# Opt level: O2

void notify_callback(result *res,vector<int,_std::allocator<int>_> *v)

{
  int *piVar1;
  ostream *poVar2;
  int *x;
  int *piVar3;
  
  nonstd::result::get();
  piVar1 = (v->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
           _M_finish;
  for (piVar3 = (v->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
                _M_start; piVar3 != piVar1; piVar3 = piVar3 + 1) {
    poVar2 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,*piVar3);
    std::operator<<(poVar2,"->");
  }
  std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
  std::operator<<((ostream *)&std::cout,"print job done\n");
  return;
}

Assistant:

void notify_callback(nonstd::result &res, std::vector<int> &v)
{
   res.get();
   //print
   for (auto &x: v)
     {
        std::cout << x << "->";
     }
   std::cout << std::endl;
   std::cout << "print job done\n";
}